

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_ech(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  ParameterError PVar2;
  size_t sVar3;
  FILE *__stream;
  char **str;
  char *pcVar4;
  char *tmpcfg;
  char *local_30;
  
  if (!feature_ech) {
    return PARAM_LIBCURL_DOESNT_SUPPORT;
  }
  sVar3 = strlen(nextarg);
  if ((sVar3 < 5) || (iVar1 = curl_strnequal("pn:",nextarg,3), iVar1 == 0)) {
    sVar3 = strlen(nextarg);
    if ((sVar3 < 6) || (iVar1 = curl_strnequal("ecl:",nextarg,4), iVar1 == 0)) {
      str = &config->ech;
    }
    else {
      if (nextarg[4] == '@') {
        local_30 = (char *)0x0;
        pcVar4 = nextarg + 5;
        iVar1 = strcmp("-",pcVar4);
        __stream = _stdin;
        if (iVar1 != 0) {
          __stream = fopen64(pcVar4,"r");
        }
        if (__stream == (FILE *)0x0) {
          warnf(global,"Couldn\'t read file \"%s\" specified for \"--ech ecl:\" option",pcVar4);
          return PARAM_BAD_USE;
        }
        PVar2 = file2string(&local_30,(FILE *)__stream);
        if (__stream != _stdin) {
          fclose(__stream);
        }
        if (PVar2 != PARAM_OK) {
          return PVar2;
        }
        pcVar4 = (char *)curl_maprintf("ecl:%s",local_30);
        config->ech_config = pcVar4;
        free(local_30);
        if (config->ech_config == (char *)0x0) {
          return PARAM_NO_MEM;
        }
        return PARAM_OK;
      }
      str = &config->ech_config;
    }
  }
  else {
    str = &config->ech_public;
  }
  PVar2 = getstr(str,nextarg,false);
  return PVar2;
}

Assistant:

static ParameterError parse_ech(struct GlobalConfig *global,
                                struct OperationConfig *config,
                                const char *nextarg)
{
  ParameterError err = PARAM_OK;
  if(!feature_ech)
    err = PARAM_LIBCURL_DOESNT_SUPPORT;
  else if(strlen(nextarg) > 4 && strncasecompare("pn:", nextarg, 3)) {
    /* a public_name */
    err = getstr(&config->ech_public, nextarg, DENY_BLANK);
  }
  else if(strlen(nextarg) > 5 && strncasecompare("ecl:", nextarg, 4)) {
    /* an ECHConfigList */
    if('@' != *(nextarg + 4)) {
      err = getstr(&config->ech_config, nextarg, DENY_BLANK);
    }
    else {
      /* Indirect case: @filename or @- for stdin */
      char *tmpcfg = NULL;
      FILE *file;

      nextarg += 5;        /* skip over 'ecl:@' */
      if(!strcmp("-", nextarg)) {
        file = stdin;
      }
      else {
        file = fopen(nextarg, FOPEN_READTEXT);
      }
      if(!file) {
        warnf(global,
              "Couldn't read file \"%s\" "
              "specified for \"--ech ecl:\" option",
              nextarg);
        return PARAM_BAD_USE; /*  */
      }
      err = file2string(&tmpcfg, file);
      if(file != stdin)
        fclose(file);
      if(err)
        return err;
      config->ech_config = aprintf("ecl:%s",tmpcfg);
      free(tmpcfg);
      if(!config->ech_config)
        return PARAM_NO_MEM;
    } /* file done */
  }
  else {
    /* Simple case: just a string, with a keyword */
    err = getstr(&config->ech, nextarg, DENY_BLANK);
  }
  return err;
}